

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

void __thiscall mini_bus::MiniBusEncoder::insert_varuint(MiniBusEncoder *this,uint64_t vuit)

{
  undefined8 local_18;
  uint64_t vuit_local;
  MiniBusEncoder *this_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)this);
  for (local_18 = vuit; 0x7f < local_18; local_18 = local_18 >> 7) {
    std::__cxx11::string::operator+=((string *)this,(byte)local_18 & 0x7f | 0x80);
  }
  std::__cxx11::string::operator+=((string *)this,(byte)local_18);
  return;
}

Assistant:

inline void insert_varuint(uint64_t vuit) {
    buffer.reserve(buffer.size() + vuit + 16);
    while (true) {
      if (vuit < 128) {
        buffer += (unsigned char) vuit;
        break;
      }
      buffer += (unsigned char) (0b10000000 | (vuit & 0b01111111));
      vuit >>= 7;
    }
  }